

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void add_rd_feature(int64_t rd,int64_t best_rd,float *features,int *feature_idx)

{
  int iVar1;
  float local_30;
  bool local_29;
  float rd_ratio;
  int rd_valid;
  int *feature_idx_local;
  float *features_local;
  int64_t best_rd_local;
  int64_t rd_local;
  
  local_29 = 0 < rd && rd < 0x7fffffffffffffff;
  if (0 < rd && rd < 0x7fffffffffffffff) {
    local_30 = (float)rd / (float)best_rd;
  }
  else {
    local_30 = 1.0;
  }
  iVar1 = *feature_idx;
  *feature_idx = iVar1 + 1;
  features[iVar1] = (float)local_29;
  iVar1 = *feature_idx;
  *feature_idx = iVar1 + 1;
  features[iVar1] = local_30;
  return;
}

Assistant:

static inline void add_rd_feature(int64_t rd, int64_t best_rd, float *features,
                                  int *feature_idx) {
  const int rd_valid = rd > 0 && rd < INT64_MAX;
  const float rd_ratio = rd_valid ? (float)rd / best_rd : 1.0f;
  features[(*feature_idx)++] = (float)rd_valid;
  features[(*feature_idx)++] = rd_ratio;
}